

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc64_fast.c
# Opt level: O0

uint64_t lzma_crc64(uint8_t *buf,size_t size,uint64_t crc)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t tmp;
  uint8_t *limit;
  uint64_t crc_local;
  size_t size_local;
  uint8_t *buf_local;
  
  limit = (uint8_t *)(crc ^ 0xffffffffffffffff);
  crc_local = size;
  size_local = (size_t)buf;
  if (4 < size) {
    for (; (size_local & 3) != 0; size_local = size_local + 1) {
      limit = (uint8_t *)
              (lzma_crc64_table[0][(ulong)*(byte *)size_local ^ (ulong)limit & 0xff] ^
              (ulong)limit >> 8);
      crc_local = crc_local - 1;
    }
    uVar3 = size_local + (crc_local & 0xfffffffffffffffc);
    crc_local = crc_local & 3;
    for (; size_local < uVar3; size_local = size_local + 4) {
      uVar1 = aligned_read32ne((uint8_t *)size_local);
      uVar2 = (uint)limit ^ uVar1;
      limit = (uint8_t *)
              (lzma_crc64_table[3][uVar2 & 0xff] ^ lzma_crc64_table[2][uVar2 >> 8 & 0xff] ^
               (ulong)limit >> 0x20 ^ lzma_crc64_table[1][uVar2 >> 0x10 & 0xff] ^
              lzma_crc64_table[0][uVar2 >> 0x18]);
    }
  }
  while (crc_local != 0) {
    limit = (uint8_t *)
            (lzma_crc64_table[0][(ulong)*(byte *)size_local ^ (ulong)limit & 0xff] ^
            (ulong)limit >> 8);
    crc_local = crc_local - 1;
    size_local = size_local + 1;
  }
  return (ulong)limit ^ 0xffffffffffffffff;
}

Assistant:

extern LZMA_API(uint64_t)
lzma_crc64(const uint8_t *buf, size_t size, uint64_t crc)
{
	crc = ~crc;

#ifdef WORDS_BIGENDIAN
	crc = bswap64(crc);
#endif

	if (size > 4) {
		while ((uintptr_t)(buf) & 3) {
			crc = lzma_crc64_table[0][*buf++ ^ A1(crc)] ^ S8(crc);
			--size;
		}

		const uint8_t *const limit = buf + (size & ~(size_t)(3));
		size &= (size_t)(3);

		while (buf < limit) {
#ifdef WORDS_BIGENDIAN
			const uint32_t tmp = (crc >> 32)
					^ aligned_read32ne(buf);
#else
			const uint32_t tmp = crc ^ aligned_read32ne(buf);
#endif
			buf += 4;

			crc = lzma_crc64_table[3][A(tmp)]
			    ^ lzma_crc64_table[2][B(tmp)]
			    ^ S32(crc)
			    ^ lzma_crc64_table[1][C(tmp)]
			    ^ lzma_crc64_table[0][D(tmp)];
		}
	}

	while (size-- != 0)
		crc = lzma_crc64_table[0][*buf++ ^ A1(crc)] ^ S8(crc);

#ifdef WORDS_BIGENDIAN
	crc = bswap64(crc);
#endif

	return ~crc;
}